

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyValue.cpp
# Opt level: O0

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Vault::KeyValue::updateMetadata
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,KeyValue *this,Path *path,Parameters *parameters)

{
  Client *client;
  Url local_50;
  Parameters *local_28;
  Parameters *parameters_local;
  Path *path_local;
  KeyValue *this_local;
  
  local_28 = parameters;
  parameters_local = (Parameters *)path;
  path_local = (Path *)this;
  this_local = (KeyValue *)__return_storage_ptr__;
  if (this->version_ == v2) {
    client = this->client_;
    getMetadataUrl(&local_50,this,path);
    HttpConsumer::post(__return_storage_ptr__,client,&local_50,local_28);
    Tiny<Vault::UrlDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~Tiny(&local_50);
  }
  else {
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::optional(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string>
Vault::KeyValue::updateMetadata(const Path &path,
                                const Parameters &parameters) {
  if (version_ != KeyValue::Version::v2) {
    return std::nullopt;
  }

  return Vault::HttpConsumer::post(client_, getMetadataUrl(path), parameters);
}